

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O1

void nn_req_term(nn_req *self)

{
  nn_timer_term(&(self->task).timer);
  nn_task_term(&self->task);
  nn_msg_term(&(self->task).reply);
  nn_msg_term(&(self->task).request);
  nn_fsm_term(&self->fsm);
  nn_xreq_term(&self->xreq);
  return;
}

Assistant:

void nn_req_term (struct nn_req *self)
{
    nn_timer_term (&self->task.timer);
    nn_task_term (&self->task);
    nn_msg_term (&self->task.reply);
    nn_msg_term (&self->task.request);
    nn_fsm_term (&self->fsm);
    nn_xreq_term (&self->xreq);
}